

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

ssize_t __thiscall
blc::network::Socket::read_abi_cxx11_(Socket *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined8 uVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  long lVar3;
  int ret;
  char tmp;
  string *str;
  string *in_stack_00000148;
  exception *in_stack_00000150;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int iVar4;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffb4;
  char local_12 [2];
  long local_10;
  Socket *local_8;
  
  lVar3 = CONCAT44(in_register_00000034,__fd);
  local_12[1] = 0;
  local_10 = lVar3;
  local_8 = this;
  std::__cxx11::string::string((string *)this);
  if ((*(byte *)(lVar3 + 0x40) & 1) != 0) {
    while (((sVar2 = recv(*(int *)(lVar3 + 8),local_12,1,0), 0 < (int)sVar2 && (local_12[0] != '\n')
            ) && (local_12[0] != '\0'))) {
      std::__cxx11::string::operator+=((string *)this,local_12[0]);
      iVar4 = 1;
      std::chrono::duration<double,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<double,std::ratio<1l,1000l>> *)&stack0xffffffffffffffa8,
                 (int *)&stack0xffffffffffffffa4);
      std::this_thread::sleep_for<double,std::ratio<1l,1000l>>
                ((duration<double,_std::ratio<1L,_1000L>_> *)
                 CONCAT44(iVar4,in_stack_ffffffffffffffa0));
    }
    return (ssize_t)this;
  }
  uVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
  uVar1 = __cxa_allocate_exception(0x78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,uVar5),in_stack_ffffffffffffffa8,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  error::exception::exception(in_stack_00000150,in_stack_00000148);
  __cxa_throw(uVar1,&error::exception::typeinfo,error::exception::~exception);
}

Assistant:

std::string blc::network::Socket::read() const {
	std::string	str;
	char		tmp;
	int		ret;

	if (this->_opened == false)
		throw blc::error::exception("not opened");
	while ((ret = recv(this->_socket, &tmp, 1, 0)) > 0) {
		if (tmp == '\n' || tmp == '\0')
			break;
		str += tmp;
		std::this_thread::sleep_for(std::chrono::duration<double, std::milli>(1));
	}
	return (str);
}